

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O1

Error __thiscall
asmjit::BaseBuilder::_newEmbedDataNode
          (BaseBuilder *this,EmbedDataNode **out,uint32_t typeId,void *data,size_t itemCount,
          size_t repeatCount)

{
  byte bVar1;
  uint8_t *puVar2;
  undefined1 auVar3 [16];
  int iVar4;
  Error extraout_EAX;
  Error EVar5;
  Error EVar6;
  ulong uVar7;
  EmbedDataNode *pEVar8;
  anon_union_64_2_7f42e22f_for_EmbedDataNode_3 *paVar9;
  anon_union_64_2_7f42e22f_for_EmbedDataNode_3 *__dest;
  size_t unaff_R12;
  EmbedDataNode **local_50;
  ulong local_48;
  size_t local_38;
  
  *out = (EmbedDataNode *)0x0;
  iVar4 = 0;
  if ((typeId & 0xfffffffe) == 0x20) {
    iVar4 = (uint)(((this->super_BaseEmitter)._environment._arch & 1) == 0) * 2 + 6;
  }
  if ((iVar4 + typeId) - 0x20 < 0x45) {
    if (iVar4 + typeId < 0x100) {
      bVar1 = Type::_typeData[(ulong)(iVar4 + typeId) + 0x100];
      auVar3._8_8_ = 0;
      auVar3._0_8_ = itemCount;
      auVar3 = auVar3 * ZEXT116(bVar1);
      uVar7 = auVar3._0_8_;
      if (auVar3._8_8_ == 0) {
        if ((this->_allocator)._zone == (Zone *)0x0) {
          _newEmbedDataNode();
          EVar6 = extraout_EAX;
        }
        else {
          pEVar8 = (EmbedDataNode *)ZoneAllocator::_alloc(&this->_allocator,0x80,&local_38);
          EVar5 = 0;
          unaff_R12 = repeatCount;
          EVar6 = 0;
          local_50 = out;
          local_48 = uVar7;
          if (pEVar8 != (EmbedDataNode *)0x0) {
            (pEVar8->super_BaseNode).field_0.field_0._prev = (BaseNode *)0x0;
            (pEVar8->super_BaseNode).field_0.field_0._next = (BaseNode *)0x0;
            (pEVar8->super_BaseNode).field_1._any._nodeType = '\x05';
            (pEVar8->super_BaseNode).field_1._any._nodeFlags = (byte)this->_nodeFlags | 2;
            *(undefined8 *)((long)&(pEVar8->super_BaseNode).field_1 + 2) = 0;
            *(undefined8 *)((long)&(pEVar8->super_BaseNode).field_3 + 2) = 0;
            *(undefined8 *)((long)&(pEVar8->super_BaseNode)._passData + 2) = 0;
            *(undefined8 *)((long)&(pEVar8->super_BaseNode)._inlineComment + 2) = 0;
            pEVar8->_itemCount = 0;
            pEVar8->_repeatCount = 0;
            *(undefined2 *)((long)&(pEVar8->super_BaseNode).field_1 + 2) = 0x123;
            (pEVar8->field_2)._externalData = (uint8_t *)0x0;
            *(undefined8 *)((long)&pEVar8->field_2 + 8) = 0;
            *(undefined8 *)((long)&pEVar8->field_2 + 0x10) = 0;
            *(undefined8 *)((long)&pEVar8->field_2 + 0x18) = 0;
            *(undefined8 *)((long)&pEVar8->field_2 + 0x20) = 0;
            *(undefined8 *)((long)&pEVar8->field_2 + 0x28) = 0;
            *(undefined8 *)((long)&pEVar8->field_2 + 0x30) = 0;
            *(undefined8 *)((long)&pEVar8->field_2 + 0x38) = 0;
            goto LAB_00112d36;
          }
        }
        EVar5 = EVar6;
        pEVar8 = (EmbedDataNode *)0x0;
LAB_00112d36:
        if (pEVar8 == (EmbedDataNode *)0x0) {
          EVar5 = BaseEmitter::reportError(&this->super_BaseEmitter,1,(char *)0x0);
        }
        if (EVar5 == 0) {
          (pEVar8->super_BaseNode).field_1._any._reserved0 = (uint8_t)typeId;
          (pEVar8->super_BaseNode).field_1._any._reserved1 = bVar1;
          pEVar8->_itemCount = itemCount;
          pEVar8->_repeatCount = unaff_R12;
          __dest = &pEVar8->field_2;
          if (0x40 < local_48) {
            puVar2 = (this->_dataZone)._end;
            paVar9 = (anon_union_64_2_7f42e22f_for_EmbedDataNode_3 *)
                     ((ulong)((this->_dataZone)._ptr + 7) & 0xfffffffffffffff8);
            if ((paVar9 < puVar2) && (local_48 <= (ulong)((long)puVar2 - (long)paVar9->_inlineData))
               ) {
              (this->_dataZone)._ptr = paVar9->_inlineData + local_48;
            }
            else {
              paVar9 = (anon_union_64_2_7f42e22f_for_EmbedDataNode_3 *)
                       Zone::_alloc(&this->_dataZone,local_48,8);
            }
            if (paVar9 == (anon_union_64_2_7f42e22f_for_EmbedDataNode_3 *)0x0) {
              EVar6 = BaseEmitter::reportError(&this->super_BaseEmitter,1,(char *)0x0);
              return EVar6;
            }
            __dest->_externalData = (uint8_t *)paVar9;
            __dest = paVar9;
          }
          if (data != (void *)0x0) {
            memcpy(__dest,data,local_48);
          }
          *local_50 = pEVar8;
          EVar5 = 0;
        }
        return EVar5;
      }
    }
    else {
      _newEmbedDataNode();
    }
    EVar6 = 1;
  }
  else {
    EVar6 = 2;
  }
  EVar6 = BaseEmitter::reportError(&this->super_BaseEmitter,EVar6,(char *)0x0);
  return EVar6;
}

Assistant:

Error BaseBuilder::_newEmbedDataNode(EmbedDataNode** out, uint32_t typeId, const void* data, size_t itemCount, size_t repeatCount) {
  *out = nullptr;

  uint32_t deabstractDelta = Type::deabstractDeltaOfSize(registerSize());
  uint32_t finalTypeId = Type::deabstract(typeId, deabstractDelta);

  if (ASMJIT_UNLIKELY(!Type::isValid(finalTypeId)))
    return reportError(DebugUtils::errored(kErrorInvalidArgument));

  uint32_t typeSize = Type::sizeOf(finalTypeId);
  Support::FastUInt8 of = 0;

  size_t dataSize = Support::mulOverflow(itemCount, size_t(typeSize), &of);
  if (ASMJIT_UNLIKELY(of))
    return reportError(DebugUtils::errored(kErrorOutOfMemory));

  EmbedDataNode* node;
  ASMJIT_PROPAGATE(_newNodeT<EmbedDataNode>(&node));

  node->_embed._typeId = uint8_t(typeId);
  node->_embed._typeSize = uint8_t(typeSize);
  node->_itemCount = itemCount;
  node->_repeatCount = repeatCount;

  uint8_t* dstData = node->_inlineData;
  if (dataSize > EmbedDataNode::kInlineBufferSize) {
    dstData = static_cast<uint8_t*>(_dataZone.alloc(dataSize, 8));
    if (ASMJIT_UNLIKELY(!dstData))
      return reportError(DebugUtils::errored(kErrorOutOfMemory));
    node->_externalData = dstData;
  }

  if (data)
    memcpy(dstData, data, dataSize);

  *out = node;
  return kErrorOk;
}